

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O2

void gpu_free_renderer_register(void)

{
  long lVar1;
  
  for (lVar1 = 0x18; lVar1 != 0x1a8; lVar1 = lVar1 + 0x28) {
    *(char **)((long)_gpu_renderer_map + lVar1 + 0x88) = "Unknown";
    *(undefined4 *)((long)_gpu_renderer_map + lVar1 + 0x90) = 0;
    *(undefined8 *)((long)&_gpu_renderer_register[0].id.name + lVar1) = 0;
    *(undefined8 *)((long)&_gpu_renderer_register[0].id.renderer + lVar1) = 0;
  }
  for (lVar1 = 0; lVar1 != 0xa0; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)_gpu_renderer_map + lVar1) = 0;
  }
  _gpu_renderer_register_is_initialized = 0;
  _gpu_renderer_order_size = 0;
  return;
}

Assistant:

void gpu_free_renderer_register(void)
{
	int i;

	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		_gpu_renderer_register[i].id.name = "Unknown";
		_gpu_renderer_register[i].id.renderer = GPU_RENDERER_UNKNOWN;
		_gpu_renderer_register[i].createFn = NULL;
		_gpu_renderer_register[i].freeFn = NULL;
	}
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		_gpu_renderer_map[i] = NULL;
	}
	
	_gpu_renderer_register_is_initialized = 0;
	_gpu_renderer_order_size = 0;
}